

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image * rf_get_screen_data_ez(void)

{
  rf_source_location source_location;
  undefined1 auVar1 [24];
  rf_image *in_RDI;
  uint uStack_54;
  rf_allocator local_38;
  undefined8 local_28;
  code *local_20;
  rf_color *local_18;
  rf_color *dst;
  int size;
  
  if (((rf__ctx->field_0).render_width < 0) || ((rf__ctx->field_0).render_height < 0)) {
    memset(in_RDI,0,0x18);
  }
  else {
    dst._4_4_ = (rf__ctx->field_0).render_width * (rf__ctx->field_0).render_height;
    local_28 = 0;
    local_20 = rf_libc_allocator_wrapper;
    local_38.user_data = (void *)0x0;
    local_38.allocator_proc = rf_libc_allocator_wrapper;
    source_location.proc_name = "rf_get_screen_data_ez";
    source_location.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    source_location.line_in_file = 0x93ed;
    auVar1._8_8_ = (ulong)uStack_54 << 0x20;
    auVar1._0_8_ = (long)dst._4_4_ << 2;
    auVar1._16_8_ = 0;
    local_18 = (rf_color *)
               rf_libc_allocator_wrapper
                         (&local_38,source_location,RF_AM_ALLOC,(rf_allocator_args)(auVar1 << 0x40))
    ;
    rf_get_screen_data(in_RDI,local_18,(long)dst._4_4_);
  }
  return in_RDI;
}

Assistant:

RF_API rf_image rf_get_screen_data_ez()
{
    if (rf_ctx.render_width < 0 || rf_ctx.render_height < 0) return (rf_image) {0};

    int size = rf_ctx.render_width * rf_ctx.render_height;
    rf_color* dst = RF_ALLOC(RF_DEFAULT_ALLOCATOR, size * sizeof(rf_color));
    rf_image result = rf_get_screen_data(dst, size);

    return result;
}